

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-internal-inl.h
# Opt level: O0

int testing::internal::GetNextRandomSeed(int seed)

{
  bool bVar1;
  ostream *poVar2;
  int in_EDI;
  int in_stack_0000001c;
  char *in_stack_00000020;
  GTestLogSeverity in_stack_0000002c;
  GTestLog *in_stack_00000030;
  int next_seed;
  int local_54;
  bool local_19;
  GTestLog local_8;
  int local_4;
  
  local_19 = 0 < in_EDI && in_EDI < 100000;
  local_4 = in_EDI;
  bVar1 = IsTrue(local_19);
  if (!bVar1) {
    GTestLog::GTestLog(in_stack_00000030,in_stack_0000002c,in_stack_00000020,in_stack_0000001c);
    poVar2 = GTestLog::GetStream(&local_8);
    poVar2 = std::operator<<(poVar2,"Condition 1 <= seed && seed <= kMaxRandomSeed failed. ");
    poVar2 = std::operator<<(poVar2,"Invalid random seed ");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,local_4);
    poVar2 = std::operator<<(poVar2," - must be in [1, ");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,99999);
    std::operator<<(poVar2,"].");
    GTestLog::~GTestLog((GTestLog *)poVar2);
  }
  local_54 = local_4 + 1;
  if (99999 < local_54) {
    local_54 = 1;
  }
  return local_54;
}

Assistant:

inline int GetNextRandomSeed(int seed) {
  GTEST_CHECK_(1 <= seed && seed <= kMaxRandomSeed)
      << "Invalid random seed " << seed << " - must be in [1, "
      << kMaxRandomSeed << "].";
  const int next_seed = seed + 1;
  return (next_seed > kMaxRandomSeed) ? 1 : next_seed;
}